

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsluv.c
# Opt level: O0

void hpluv2lch(Triplet *in_out)

{
  double dVar1;
  double dVar2;
  double *in_RDI;
  double dVar3;
  double c;
  double l;
  double s;
  double h;
  double in_stack_00000080;
  double local_28;
  double local_10;
  
  local_10 = *in_RDI;
  dVar1 = in_RDI[1];
  dVar2 = in_RDI[2];
  if ((99.9999999 < dVar2) || (dVar2 < 1e-08)) {
    local_28 = 0.0;
  }
  else {
    dVar3 = max_safe_chroma_for_l(in_stack_00000080);
    local_28 = (dVar3 / 100.0) * dVar1;
  }
  if (dVar1 < 1e-08) {
    local_10 = 0.0;
  }
  *in_RDI = dVar2;
  in_RDI[1] = local_28;
  in_RDI[2] = local_10;
  return;
}

Assistant:

static void
hpluv2lch(Triplet* in_out)
{
    double h = in_out->a;
    double s = in_out->b;
    double l = in_out->c;
    double c;

    /* White and black: disambiguate chroma */
    if(l > 99.9999999 || l < 0.00000001)
        c = 0.0;
    else
        c = max_safe_chroma_for_l(l) / 100.0 * s;

    /* Grays: disambiguate hue */
    if (s < 0.00000001)
        h = 0.0;

    in_out->a = l;
    in_out->b = c;
    in_out->c = h;
}